

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

size_t doh_write_cb(void *contents,size_t size,size_t nmemb,void *userp)

{
  void *pvVar1;
  size_t __n;
  size_t size_00;
  
  __n = size * nmemb;
  size_00 = *(long *)((long)userp + 8) + __n;
  if (size_00 < 0xbb9) {
    pvVar1 = Curl_saferealloc(*userp,size_00);
    *(void **)userp = pvVar1;
    if (pvVar1 != (void *)0x0) {
      memcpy((void *)((long)pvVar1 + *(long *)((long)userp + 8)),contents,__n);
      *(long *)((long)userp + 8) = *(long *)((long)userp + 8) + __n;
      return __n;
    }
  }
  return 0;
}

Assistant:

static size_t
doh_write_cb(void *contents, size_t size, size_t nmemb, void *userp)
{
  size_t realsize = size * nmemb;
  struct dohresponse *mem = (struct dohresponse *)userp;

  if((mem->size + realsize) > DOH_MAX_RESPONSE_SIZE)
    /* suspiciously much for us */
    return 0;

  mem->memory = Curl_saferealloc(mem->memory, mem->size + realsize);
  if(!mem->memory)
    /* out of memory! */
    return 0;

  memcpy(&(mem->memory[mem->size]), contents, realsize);
  mem->size += realsize;

  return realsize;
}